

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O0

void ssl_write_ecjpake_kkpp_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  uchar *puVar1;
  uchar *buf_00;
  size_t local_40;
  size_t kkpp_len;
  uchar *end;
  uchar *p;
  size_t *psStack_20;
  int ret;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  p._4_4_ = 0xffffff92;
  kkpp_len = (size_t)(ssl->out_msg + 0x400);
  *olen = 0;
  if (ssl->handshake->ciphersuite_info->key_exchange == '\v') {
    end = buf;
    psStack_20 = olen;
    olen_local = (size_t *)buf;
    buf_local = (uchar *)ssl;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x795,"server hello, ecjpake kkpp extension");
    if ((long)(kkpp_len - (long)end) < 4) {
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)buf_local,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x798,"buffer too small");
    }
    else {
      mbedtls_put_unaligned_uint16(end,1);
      puVar1 = end + 2;
      buf_00 = end + 4;
      end = puVar1;
      p._4_4_ = mbedtls_ecjpake_write_round_one
                          ((mbedtls_ecjpake_context *)(*(long *)(buf_local + 0x68) + 0x1c0),buf_00,
                           (kkpp_len - (long)puVar1) - 2,&local_40,
                           *(_func_int_void_ptr_uchar_ptr_size_t **)(*(long *)buf_local + 0x28),
                           *(void **)(*(long *)buf_local + 0x30));
      if (p._4_4_ == 0) {
        mbedtls_put_unaligned_uint16(end,(ushort)local_40 << 8 | (ushort)local_40 >> 8);
        *psStack_20 = local_40 + 4;
      }
      else {
        mbedtls_debug_print_ret
                  ((mbedtls_ssl_context *)buf_local,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x7ae,"mbedtls_ecjpake_write_round_one",p._4_4_);
      }
    }
  }
  return;
}

Assistant:

static void ssl_write_ecjpake_kkpp_ext(mbedtls_ssl_context *ssl,
                                       unsigned char *buf,
                                       size_t *olen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = buf;
    const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_OUT_CONTENT_LEN;
    size_t kkpp_len;

    *olen = 0;

    /* Skip costly computation if not needed */
    if (ssl->handshake->ciphersuite_info->key_exchange !=
        MBEDTLS_KEY_EXCHANGE_ECJPAKE) {
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG(3, ("server hello, ecjpake kkpp extension"));

    if (end - p < 4) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("buffer too small"));
        return;
    }

    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_ECJPAKE_KKPP, p, 0);
    p += 2;

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    ret = mbedtls_psa_ecjpake_write_round(&ssl->handshake->psa_pake_ctx,
                                          p + 2, end - p - 2, &kkpp_len,
                                          MBEDTLS_ECJPAKE_ROUND_ONE);
    if (ret != 0) {
        psa_destroy_key(ssl->handshake->psa_pake_password);
        psa_pake_abort(&ssl->handshake->psa_pake_ctx);
        MBEDTLS_SSL_DEBUG_RET(1, "psa_pake_output", ret);
        return;
    }
#else
    ret = mbedtls_ecjpake_write_round_one(&ssl->handshake->ecjpake_ctx,
                                          p + 2, end - p - 2, &kkpp_len,
                                          ssl->conf->f_rng, ssl->conf->p_rng);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ecjpake_write_round_one", ret);
        return;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    MBEDTLS_PUT_UINT16_BE(kkpp_len, p, 0);
    p += 2;

    *olen = kkpp_len + 4;
}